

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_50;
  
  fputc(10,(FILE *)outfile);
  local_50 = 0;
  for (lVar3 = 0; plVar1 = (long *)A->content, lVar3 < *plVar1; lVar3 = lVar3 + 1) {
    lVar7 = plVar1[1];
    lVar4 = lVar3 - plVar1[4];
    lVar2 = plVar1[3];
    lVar5 = 0;
    lVar6 = 0;
    if (0 < lVar4) {
      lVar5 = lVar4;
      lVar6 = lVar4;
    }
    while (lVar5 != 0) {
      fprintf((FILE *)outfile,"%12s  ","");
      lVar5 = lVar5 + -1;
    }
    lVar5 = lVar7 + -1;
    if (lVar2 + lVar3 < lVar7) {
      lVar5 = lVar2 + lVar3;
    }
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    lVar7 = local_50 + lVar4 * -8;
    for (; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
      fprintf((FILE *)outfile,"% .15e  ",
              *(undefined8 *)
               (lVar7 + *(long *)((long)A->content + 0x28) * 8 +
                        *(long *)(*(long *)((long)A->content + 0x40) + lVar6 * 8)));
      lVar7 = lVar7 + -8;
    }
    fputc(10,(FILE *)outfile);
    local_50 = local_50 + 8;
  }
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, start, finish;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_B(A); i++)
  {
    start  = SUNMAX(0, i - SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A) - 1, i + SM_UBAND_B(A));
    for (j = 0; j < start; j++) { fprintf(outfile, "%12s  ", ""); }
    for (j = start; j <= finish; j++)
    {
      fprintf(outfile, SUN_FORMAT_E "  ", SM_ELEMENT_B(A, i, j));
    }
    fprintf(outfile, "\n");
  }
  return;
}